

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_number.cpp
# Opt level: O2

void __thiscall JsonNumber_MinusOnly_Test::TestBody(JsonNumber_MinusOnly_Test *this)

{
  parser<callbacks_proxy<mock_json_callbacks>_> *this_00;
  char *message;
  AssertHelper local_e0;
  error_code local_d8;
  AssertionResult gtest_ar;
  parser<callbacks_proxy<mock_json_callbacks>_> p;
  
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::parser
            (&p,(this->super_JsonNumber).proxy_.original_,none);
  s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,"-",1)
  ;
  this_00 = pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::input
                      (&p,(string *)&gtest_ar);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::eof(this_00);
  std::__cxx11::string::~string((string *)&gtest_ar);
  local_d8._M_cat = pstore::json::get_error_category();
  local_d8._M_value = 4;
  testing::internal::CmpHelperEQ<std::error_code,std::error_code>
            ((internal *)&gtest_ar,"p.last_error ()",
             "make_error_code (json::error_code::expected_digits)",&p.error_,&local_d8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_number.cpp"
               ,0x55,message);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if ((long *)CONCAT44(local_d8._4_4_,local_d8._M_value) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_d8._4_4_,local_d8._M_value) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::~parser(&p);
  return;
}

Assistant:

TEST_F (JsonNumber, MinusOnly) {
    json::parser<decltype (proxy_)> p (proxy_);
    p.input ("-"s).eof ();
    EXPECT_EQ (p.last_error (), make_error_code (json::error_code::expected_digits));
}